

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::MapTextureSubresource
          (DeviceContextGLImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 ArraySlice,
          MAP_TYPE MapType,MAP_FLAGS MapFlags,Box *pMapRegion,MappedTextureSubresource *MappedData)

{
  undefined *puVar1;
  TextureBaseGL *this_00;
  TextureDesc *TexDesc_00;
  IBuffer *Ptr;
  undefined8 uVar2;
  MappedTextureSubresource local_c0;
  undefined1 local_98 [8];
  string _msg;
  BufferGLImpl *pPBO;
  MipLevelProperties MipLevelAttribs;
  Uint64 PBOOffset;
  TextureDesc *TexDesc;
  TextureBaseGL *pTexGL;
  MAP_FLAGS MapFlags_local;
  MAP_TYPE MapType_local;
  Uint32 ArraySlice_local;
  Uint32 MipLevel_local;
  ITexture *pTexture_local;
  DeviceContextGLImpl *this_local;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::MapTextureSubresource
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,pTexture,MipLevel,
             ArraySlice,MapType,MapFlags,pMapRegion,MappedData);
  this_00 = ClassPtrCast<Diligent::TextureBaseGL,Diligent::ITexture>(pTexture);
  TexDesc_00 = (TextureDesc *)
               (**(code **)((long)(this_00->super_TextureBase<Diligent::EngineGLImplTraits>).
                                  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                                  .super_ObjectBase<Diligent::ITextureGL>.
                                  super_RefCountedObject<Diligent::ITextureGL>.super_ITextureGL.
                                  super_ITexture.super_IDeviceObject + 0x20))();
  if (TexDesc_00->Usage == USAGE_STAGING) {
    MipLevelAttribs.MipSize = GetStagingTextureSubresourceOffset(TexDesc_00,ArraySlice,MipLevel,4);
    GetMipLevelProperties((MipLevelProperties *)&pPBO,TexDesc_00,MipLevel);
    Ptr = TextureBaseGL::GetPBO(this_00);
    _msg.field_2._8_8_ = ClassPtrCast<Diligent::BufferGLImpl,Diligent::IBuffer>(Ptr);
    BufferGLImpl::MapRange
              ((BufferGLImpl *)_msg.field_2._8_8_,&this->m_ContextState,MapType,(uint)MapFlags,
               MipLevelAttribs.MipSize,MipLevelAttribs.DepthSliceSize,&MappedData->pData);
    MappedData->Stride = MipLevelAttribs._16_8_;
    MappedData->DepthStride = MipLevelAttribs.DepthSliceSize;
  }
  else {
    FormatString<char[46]>
              ((string *)local_98,(char (*) [46])"Only staging textures can be mapped in OpenGL");
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_98);
    MappedTextureSubresource::MappedTextureSubresource(&local_c0);
    MappedData->pData = local_c0.pData;
    MappedData->Stride = local_c0.Stride;
    MappedData->DepthStride = local_c0.DepthStride;
  }
  return;
}

Assistant:

void DeviceContextGLImpl::MapTextureSubresource(ITexture*                 pTexture,
                                                Uint32                    MipLevel,
                                                Uint32                    ArraySlice,
                                                MAP_TYPE                  MapType,
                                                MAP_FLAGS                 MapFlags,
                                                const Box*                pMapRegion,
                                                MappedTextureSubresource& MappedData)
{
    TDeviceContextBase::MapTextureSubresource(pTexture, MipLevel, ArraySlice, MapType, MapFlags, pMapRegion, MappedData);
    TextureBaseGL*     pTexGL  = ClassPtrCast<TextureBaseGL>(pTexture);
    const TextureDesc& TexDesc = pTexGL->GetDesc();
    if (TexDesc.Usage == USAGE_STAGING)
    {
        Uint64             PBOOffset       = GetStagingTextureSubresourceOffset(TexDesc, ArraySlice, MipLevel, TextureBaseGL::PBOOffsetAlignment);
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);
        BufferGLImpl*      pPBO            = ClassPtrCast<BufferGLImpl>(pTexGL->GetPBO());
        pPBO->MapRange(m_ContextState, MapType, MapFlags, PBOOffset, MipLevelAttribs.MipSize, MappedData.pData);

        MappedData.Stride      = MipLevelAttribs.RowSize;
        MappedData.DepthStride = MipLevelAttribs.MipSize;
    }
    else
    {
        LOG_ERROR_MESSAGE("Only staging textures can be mapped in OpenGL");
        MappedData = MappedTextureSubresource{};
    }
}